

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall libcellml::Model::~Model(Model *this)

{
  ModelImpl *this_00;
  Model *this_local;
  
  (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
       (_func_int **)&PTR__Model_0046a030;
  this_00 = pFunc(this);
  if (this_00 != (ModelImpl *)0x0) {
    ModelImpl::~ModelImpl(this_00);
    operator_delete(this_00,0xa0);
  }
  std::enable_shared_from_this<libcellml::Model>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<libcellml::Model>);
  ComponentEntity::~ComponentEntity(&this->super_ComponentEntity);
  return;
}

Assistant:

Model::~Model()
{
    delete pFunc();
}